

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

IResultCapture * Catch::getResultCapture(void)

{
  int iVar1;
  IMutableContext *pIVar2;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  ReusableStringStream RStack_58;
  SourceLineInfo local_40;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar2 = getCurrentMutableContext();
  iVar1 = (*(pIVar2->super_IContext)._vptr_IContext[2])(pIVar2);
  if ((IResultCapture *)CONCAT44(extraout_var,iVar1) == (IResultCapture *)0x0) {
    ReusableStringStream::ReusableStringStream(&RStack_58);
    local_40.file =
         "/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp"
    ;
    local_40.line = 0x335f;
    operator<<(RStack_58.m_oss,&local_40);
    std::operator<<(RStack_58.m_oss,": Internal Catch2 error: ");
    std::operator<<(RStack_58.m_oss,"No result capture instance");
    std::__cxx11::stringbuf::str();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      throw_logic_error(&local_30);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (IResultCapture *)CONCAT44(extraout_var,iVar1);
  }
  __stack_chk_fail();
}

Assistant:

IResultCapture& getResultCapture() {
        if (auto* capture = getCurrentContext().getResultCapture())
            return *capture;
        else
            CATCH_INTERNAL_ERROR("No result capture instance");
    }